

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

int anon_unknown.dwarf_cbbd::CheckHeader(FILE *fp,char *text)

{
  int iVar1;
  char local_25 [4];
  undefined1 local_21;
  char *pcStack_20;
  char data_check [5];
  char *text_local;
  FILE *fp_local;
  
  pcStack_20 = text;
  fread(local_25,1,4,(FILE *)fp);
  local_21 = 0;
  iVar1 = strcmp(local_25,pcStack_20);
  if (iVar1 != 0) {
    printf("Header error.\n");
    fclose((FILE *)fp);
  }
  fp_local._4_4_ = (uint)(iVar1 == 0);
  return fp_local._4_4_;
}

Assistant:

static int CheckHeader(FILE *fp, const char *text) {
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "F0  "
  data_check[4] = '\0';
  if (0 != strcmp(data_check, text)) {
    printf("Header error.\n");
    fclose(fp);
    return 0;
  }
  return 1;
}